

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNESROM.cpp
# Opt level: O1

void __thiscall SNESROM::SNESROM(SNESROM *this,string *ROMImagePath)

{
  SNESROMHeader *this_00;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  Logger *pLVar4;
  long *plVar5;
  ROMAddress *this_01;
  undefined8 *puVar6;
  ulong uVar7;
  long *plVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Db_01;
  ImageAddress headerAddress;
  string __str;
  uint local_94;
  SNESROMHeader local_90 [2];
  uint8_t local_80 [16];
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined2 *local_50 [2];
  undefined2 local_40 [8];
  
  readBytesFromFile(&this->m_actualImageData,ROMImagePath);
  this->m_headerlessImageData = (uint8_t *)0x0;
  this_00 = &this->m_SNESROMHeader;
  SNESROMHeader::SNESROMHeader(this_00);
  (this->m_SMCHeader).m_bytes = (uint8_t *)0x0;
  puVar1 = (this->m_actualImageData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->m_actualImageData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar7 = (long)puVar2 - (long)puVar1;
  if ((uVar7 & 0x1ff) != 0) {
    __assert_fail("m_actualImageData.size() % 512 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp"
                  ,0x37,"SNESROM::SNESROM(const std::string &)");
  }
  if (puVar2 != puVar1) {
    uVar7 = (ulong)((uint)uVar7 & 0x200);
    this->m_headerlessImageData = puVar1 + uVar7;
    if (uVar7 != 0) {
      (this->m_SMCHeader).m_bytes = puVar1;
      pLVar4 = Logger::Instance();
      local_90[0].m_HeaderData = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"ROM has a SMC-Header","");
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'\x02');
      *local_50[0] = 0x3336;
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x107569);
      plVar8 = plVar5 + 2;
      if ((long *)*plVar5 == plVar8) {
        uVar9 = (undefined4)*plVar8;
        uVar10 = *(undefined4 *)((long)plVar5 + 0x14);
        local_60 = *plVar8;
        uStack_58 = (undefined4)plVar5[3];
        uStack_54 = *(undefined4 *)((long)plVar5 + 0x1c);
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar8;
        uVar9 = extraout_XMM0_Da;
        uVar10 = extraout_XMM0_Db;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      Logger::log(pLVar4,(double)CONCAT44(uVar10,uVar9));
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (local_90[0].m_HeaderData != local_80) {
        operator_delete(local_90[0].m_HeaderData);
      }
      this_01 = getROMAddressObject((RomLayout)((this->m_SMCHeader).m_bytes[2] != '\0'));
      ROMAddress::setROMAddress(this_01,0xffc0);
      (**this_01->_vptr_ROMAddress)(&local_94,this_01);
      operator_delete(this_01);
      bVar3 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + local_94);
      if (bVar3) {
        SNESROMHeader::SNESROMHeader(local_90,this->m_headerlessImageData + local_94);
        SNESROMHeader::operator=(this_00,local_90);
        SNESROMHeader::~SNESROMHeader(local_90);
      }
      else {
        pLVar4 = Logger::Instance();
        local_90[0].m_HeaderData = local_80;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_90,"SMC-Header lies about ROM layout","");
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct((ulong)local_50,'\x02');
        *local_50[0] = 0x3937;
        puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x107569)
        ;
        plVar5 = puVar6 + 2;
        if ((long *)*puVar6 == plVar5) {
          uVar9 = (undefined4)*plVar5;
          uVar10 = *(undefined4 *)((long)puVar6 + 0x14);
          local_60 = *plVar5;
          uStack_58 = *(undefined4 *)(puVar6 + 3);
          uStack_54 = *(undefined4 *)((long)puVar6 + 0x1c);
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar5;
          uVar9 = extraout_XMM0_Da_00;
          uVar10 = extraout_XMM0_Db_00;
          local_70 = (long *)*puVar6;
        }
        local_68 = puVar6[1];
        *puVar6 = plVar5;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        Logger::log(pLVar4,(double)CONCAT44(uVar10,uVar9));
        if (local_70 != &local_60) {
          operator_delete(local_70);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_90[0].m_HeaderData != local_80) {
          operator_delete(local_90[0].m_HeaderData);
        }
      }
      checkRomLayout(this);
    }
    if (this_00->m_HeaderData == (uint8_t *)0x0) {
      bVar3 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + 0x7fc0);
      if (bVar3) {
        SNESROMHeader::SNESROMHeader(local_90,this->m_headerlessImageData + 0x7fc0);
      }
      else {
        bVar3 = SNESROMHeader::mayBeThere(this->m_headerlessImageData + 0xffc0);
        if (!bVar3) {
          pLVar4 = Logger::Instance();
          local_90[0].m_HeaderData = local_80;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_90,"There is no SNES header","");
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct((ulong)local_50,'\x02');
          *local_50[0] = 0x3539;
          plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x107569);
          plVar8 = plVar5 + 2;
          if ((long *)*plVar5 == plVar8) {
            uVar9 = (undefined4)*plVar8;
            uVar10 = *(undefined4 *)((long)plVar5 + 0x14);
            local_60 = *plVar8;
            uStack_58 = (undefined4)plVar5[3];
            uStack_54 = *(undefined4 *)((long)plVar5 + 0x1c);
            local_70 = &local_60;
          }
          else {
            local_60 = *plVar8;
            uVar9 = extraout_XMM0_Da_01;
            uVar10 = extraout_XMM0_Db_01;
            local_70 = (long *)*plVar5;
          }
          local_68 = plVar5[1];
          *plVar5 = (long)plVar8;
          plVar5[1] = 0;
          *(undefined1 *)(plVar5 + 2) = 0;
          Logger::log(pLVar4,(double)CONCAT44(uVar10,uVar9));
          if (local_70 != &local_60) {
            operator_delete(local_70);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          if (local_90[0].m_HeaderData == local_80) {
            return;
          }
          operator_delete(local_90[0].m_HeaderData);
          return;
        }
        SNESROMHeader::SNESROMHeader(local_90,this->m_headerlessImageData + 0xffc0);
      }
      SNESROMHeader::operator=(this_00,local_90);
      SNESROMHeader::~SNESROMHeader(local_90);
    }
    return;
  }
  __assert_fail("m_actualImageData.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SuperMotte[P]65816Disassembler/snesdisasm/SNESROM.cpp"
                ,0x38,"SNESROM::SNESROM(const std::string &)");
}

Assistant:

SNESROM::SNESROM(const std::string &ROMImagePath)
    : m_actualImageData(readBytesFromFile(ROMImagePath)),
      m_headerlessImageData(nullptr){

    assert( m_actualImageData.size() % 512 == 0);
    assert( m_actualImageData.size() > 0);

    m_headerlessImageData = &m_actualImageData[0] +  m_actualImageData.size() % 1024;

    //this implies a SMC header
    if( m_actualImageData.size() % 1024 != 0){
        m_SMCHeader.load(&m_actualImageData[0]);
        LOG_SRC(STATE, "ROM has a SMC-Header");

        //since we have a SMC header, we ask it for lo/hi-rom status
        //not that this might be faulty so we gonna ignore that anyway
        RomLayout layout = m_SMCHeader.layout();

        //now that we know what rom-type it is, we can use that to find the header
        ROMAddress* SNESHeaderROMAddress = getROMAddressObject(layout);
        SNESHeaderROMAddress->setROMAddress(0x00FFC0);
        ImageAddress headerAddress = SNESHeaderROMAddress->toImageAddress();
        delete SNESHeaderROMAddress;

        //it is there. nice
        if(SNESROMHeader::mayBeThere(m_headerlessImageData + headerAddress)){
           m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + headerAddress);
        }else{
            LOG_SRC(WARNING, "SMC-Header lies about ROM layout");
        }


        //bad programming: we ignore everything above and use the new check function
        layout = checkRomLayout();
    }

    if(!m_SNESROMHeader){
        if(SNESROMHeader::mayBeThere(m_headerlessImageData + 0x7fc0)){
            //headerless lorom
            m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + 0x7fc0);
        }else if(SNESROMHeader::mayBeThere(m_headerlessImageData + 0xffc0)){
            //headerless hirom
            m_SNESROMHeader = SNESROMHeader(m_headerlessImageData + 0xffc0);
        }else{
            LOG_SRC(ERROR, "There is no SNES header");
        }
    }
}